

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkReal_Test::~TEST_TestHarness_c_checkReal_Test
          (TEST_TestHarness_c_checkReal_Test *this)

{
  TEST_TestHarness_c_checkReal_Test *this_local;
  
  TEST_GROUP_CppUTestGroupTestHarness_c::~TEST_GROUP_CppUTestGroupTestHarness_c
            (&this->super_TEST_GROUP_CppUTestGroupTestHarness_c);
  return;
}

Assistant:

TEST(TestHarness_c, checkReal)
{
    CHECK_EQUAL_C_REAL(1.0, 1.1, 0.5);
    fixture->setTestFunction(failRealMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1>\n\tbut was  <2>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}